

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<int,unsigned_int>::emplace_helper<unsigned_int_const&>
          (QHash<int,unsigned_int> *this,int *key,uint *args)

{
  byte bVar1;
  Entry *pEVar2;
  piter pVar3;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<int,_unsigned_int>_>::findOrInsert<int>
            ((InsertionResult *)local_38,*(Data<QHashPrivate::Node<int,_unsigned_int>_> **)this,key)
  ;
  pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    *(int *)pEVar2[bVar1].storage.data = *key;
  }
  *(uint *)(pEVar2[bVar1].storage.data + 4) = *args;
  pVar3.bucket = local_38._8_8_;
  pVar3.d = (Data<QHashPrivate::Node<int,_unsigned_int>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }